

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint * Kit_DsdTruthComputeTwo
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp,int iVar,uint *pTruthDec)

{
  uint uVar1;
  int iVar2;
  uint *pOut;
  uint *pIn;
  int local_40;
  int i;
  uint uSuppAll;
  uint *pTruthRes;
  uint *pTruthDec_local;
  int iVar_local;
  uint uSupp_local;
  Kit_DsdNtk_t *pNtk_local;
  Kit_DsdMan_t *p_local;
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x405,
                  "unsigned int *Kit_DsdTruthComputeTwo(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int, int, unsigned int *)"
                 );
  }
  if (p->nVars < (int)(uint)pNtk->nVars) {
    __assert_fail("pNtk->nVars <= p->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x406,
                  "unsigned int *Kit_DsdTruthComputeTwo(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int, int, unsigned int *)"
                 );
  }
  uVar1 = Kit_DsdGetSupports(pNtk);
  if ((uSupp & uVar1) == 0) {
    Kit_TruthClear(pTruthDec,(uint)pNtk->nVars);
    p_local = (Kit_DsdMan_t *)Kit_DsdTruthCompute(p,pNtk);
  }
  else if ((uSupp & uVar1) == uVar1) {
    p_local = (Kit_DsdMan_t *)Kit_DsdTruthCompute(p,pNtk);
    Kit_TruthCopy(pTruthDec,(uint *)p_local,(uint)pNtk->nVars);
    Kit_TruthIthVar((uint *)p_local,(uint)pNtk->nVars,iVar);
  }
  else {
    for (local_40 = 0; local_40 < (int)(uint)pNtk->nVars; local_40 = local_40 + 1) {
      pOut = (uint *)Vec_PtrEntry(p->vTtNodes,local_40);
      pIn = (uint *)Vec_PtrEntry(p->vTtElems,local_40);
      Kit_TruthCopy(pOut,pIn,p->nVars);
    }
    iVar2 = Abc_Lit2Var((uint)pNtk->Root);
    p_local = (Kit_DsdMan_t *)Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,iVar2,uSupp,iVar,pTruthDec);
    iVar2 = Abc_LitIsCompl((uint)pNtk->Root);
    if (iVar2 != 0) {
      Kit_TruthNot((uint *)p_local,(uint *)p_local,(uint)pNtk->nVars);
    }
  }
  return (uint *)p_local;
}

Assistant:

unsigned * Kit_DsdTruthComputeTwo( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    unsigned * pTruthRes, uSuppAll;
    int i;
    assert( uSupp > 0 );
    assert( pNtk->nVars <= p->nVars );
    // compute support of all nodes
    uSuppAll = Kit_DsdGetSupports( pNtk );
    // consider special case - there is no overlap
    if ( (uSupp & uSuppAll) == 0 )
    {
        Kit_TruthClear( pTruthDec, pNtk->nVars );
        return Kit_DsdTruthCompute( p, pNtk );
    }
    // consider special case - support is fully contained
    if ( (uSupp & uSuppAll) == uSuppAll )
    {
        pTruthRes = Kit_DsdTruthCompute( p, pNtk );
        Kit_TruthCopy( pTruthDec, pTruthRes, pNtk->nVars );
        Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
        return pTruthRes;
    }
    // assign elementary truth tables
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(pNtk->Root), uSupp, iVar, pTruthDec );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}